

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec.c
# Opt level: O0

void tetra_decode(tetra_codec *st,uint8_t *coded,int16_t *pcm,int bfi)

{
  uint8_t *in_RSI;
  int16_t parm [24];
  int16_t serial [138];
  Word16 *in_stack_fffffffffffffe98;
  tetra_codec *in_stack_fffffffffffffea0;
  Word16 *in_stack_fffffffffffffea8;
  tetra_codec *in_stack_fffffffffffffeb0;
  int16_t aiStack_136 [155];
  
  unpack_coded_bits(in_RSI,aiStack_136);
  Bits2prm_Tetra(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 in_stack_fffffffffffffea0->old_A);
  Decod_Tetra(stack0x00000140,(Word16 *)serial._264_8_,(Word16 *)serial._256_8_);
  Post_Process(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,0);
  return;
}

Assistant:

void tetra_decode(tetra_codec* st, const uint8_t* coded, int16_t* pcm, int bfi)
{
	int16_t serial[1 + CODED_FRAME_BIT_COUNT];
	serial[0] = bfi ? 1 : 0;
	unpack_coded_bits(coded, serial + 1);

	int16_t parm[24];
	Bits2prm_Tetra(st, serial, parm);

	Decod_Tetra(st, parm, pcm);

	Post_Process(st, pcm, TSC_L_frame);
}